

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O1

void aom_highbd_h_predictor_16x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined1 (*pauVar1) [16];
  uint16_t *puVar2;
  uint16_t *puVar3;
  undefined4 uVar5;
  undefined1 auVar4 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  auVar4 = *(undefined1 (*) [16])left;
  auVar6 = pshuflw(in_XMM1,auVar4,0);
  auVar6._4_4_ = auVar6._0_4_;
  auVar6._8_4_ = auVar6._0_4_;
  auVar6._12_4_ = auVar6._0_4_;
  *(undefined1 (*) [16])dst = auVar6;
  *(undefined1 (*) [16])(dst + 8) = auVar6;
  pauVar1 = (undefined1 (*) [16])(dst + stride);
  auVar6 = pshuflw(auVar6,auVar4,0x55);
  auVar7._0_4_ = auVar6._0_4_;
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = auVar7._0_4_;
  auVar7._12_4_ = auVar7._0_4_;
  *pauVar1 = auVar7;
  pauVar1[1] = auVar7;
  pauVar1 = (undefined1 (*) [16])((long)*pauVar1 + stride * 2);
  auVar6 = pshuflw(auVar7,auVar4,0xaa);
  auVar8._0_4_ = auVar6._0_4_;
  auVar8._4_4_ = auVar8._0_4_;
  auVar8._8_4_ = auVar8._0_4_;
  auVar8._12_4_ = auVar8._0_4_;
  *pauVar1 = auVar8;
  pauVar1[1] = auVar8;
  pauVar1 = (undefined1 (*) [16])((long)*pauVar1 + stride * 2);
  auVar6 = pshuflw(auVar8,auVar4,0xff);
  auVar9._0_4_ = auVar6._0_4_;
  auVar9._4_4_ = auVar9._0_4_;
  auVar9._8_4_ = auVar9._0_4_;
  auVar9._12_4_ = auVar9._0_4_;
  *pauVar1 = auVar9;
  pauVar1[1] = auVar9;
  pauVar1 = (undefined1 (*) [16])((long)*pauVar1 + stride * 2);
  auVar6 = pshufhw(auVar9,auVar4,0);
  auVar10._8_4_ = auVar6._8_4_;
  auVar10._4_4_ = auVar10._8_4_;
  auVar10._0_4_ = auVar10._8_4_;
  auVar10._12_4_ = auVar10._8_4_;
  *pauVar1 = auVar10;
  pauVar1[1] = auVar10;
  pauVar1 = (undefined1 (*) [16])((long)*pauVar1 + stride * 2);
  auVar6 = pshufhw(auVar10,auVar4,0x55);
  auVar11._8_4_ = auVar6._8_4_;
  auVar11._4_4_ = auVar11._8_4_;
  auVar11._0_4_ = auVar11._8_4_;
  auVar11._12_4_ = auVar11._8_4_;
  *pauVar1 = auVar11;
  pauVar1[1] = auVar11;
  puVar3 = (uint16_t *)((long)*pauVar1 + stride * 2);
  auVar6 = pshufhw(auVar11,auVar4,0xaa);
  uVar5 = auVar6._8_4_;
  *(undefined4 *)puVar3 = uVar5;
  *(undefined4 *)(puVar3 + 2) = uVar5;
  *(undefined4 *)(puVar3 + 4) = uVar5;
  *(undefined4 *)(puVar3 + 6) = uVar5;
  *(undefined4 *)(puVar3 + 8) = uVar5;
  *(undefined4 *)(puVar3 + 10) = uVar5;
  *(undefined4 *)(puVar3 + 0xc) = uVar5;
  *(undefined4 *)(puVar3 + 0xe) = uVar5;
  auVar4 = pshufhw(auVar4,auVar4,0xff);
  uVar5 = auVar4._8_4_;
  puVar2 = puVar3 + stride;
  *(undefined4 *)puVar2 = uVar5;
  *(undefined4 *)(puVar2 + 2) = uVar5;
  *(undefined4 *)(puVar2 + 4) = uVar5;
  *(undefined4 *)(puVar2 + 6) = uVar5;
  puVar3 = puVar3 + stride + 8;
  *(undefined4 *)puVar3 = uVar5;
  *(undefined4 *)(puVar3 + 2) = uVar5;
  *(undefined4 *)(puVar3 + 4) = uVar5;
  *(undefined4 *)(puVar3 + 6) = uVar5;
  return;
}

Assistant:

static inline void h_predictor_16x8(uint16_t *dst, ptrdiff_t stride,
                                    const uint16_t *left) {
  const __m128i left_u16 = _mm_load_si128((const __m128i *)left);
  const __m128i row0 = _mm_shufflelo_epi16(left_u16, 0x0);
  const __m128i row1 = _mm_shufflelo_epi16(left_u16, 0x55);
  const __m128i row2 = _mm_shufflelo_epi16(left_u16, 0xaa);
  const __m128i row3 = _mm_shufflelo_epi16(left_u16, 0xff);
  const __m128i row4 = _mm_shufflehi_epi16(left_u16, 0x0);
  const __m128i row5 = _mm_shufflehi_epi16(left_u16, 0x55);
  const __m128i row6 = _mm_shufflehi_epi16(left_u16, 0xaa);
  const __m128i row7 = _mm_shufflehi_epi16(left_u16, 0xff);
  h_store_16_unpacklo(&dst, stride, &row0);
  h_store_16_unpacklo(&dst, stride, &row1);
  h_store_16_unpacklo(&dst, stride, &row2);
  h_store_16_unpacklo(&dst, stride, &row3);
  h_store_16_unpackhi(&dst, stride, &row4);
  h_store_16_unpackhi(&dst, stride, &row5);
  h_store_16_unpackhi(&dst, stride, &row6);
  h_store_16_unpackhi(&dst, stride, &row7);
}